

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::ValuePrinter::printStringLiteral(ValuePrinter *this,Handle h)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_8d;
  allocator<char> local_7d;
  uint32_t local_7c;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string local_68;
  string local_48;
  undefined1 local_28 [16];
  ValuePrinter *local_18;
  ValuePrinter *this_local;
  Handle h_local;
  
  local_8d = this->dictionary == (StringDictionary *)0x0;
  local_18 = this;
  this_local._4_4_ = h.handle;
  if (local_8d) {
    std::__cxx11::to_string(&local_48,h.handle);
  }
  else {
    local_7c = h.handle;
    iVar1 = (*(this->dictionary->super_StringDictionary)._vptr_StringDictionary[3])
                      (this->dictionary,(ulong)h.handle);
    local_78._M_len = CONCAT44(extraout_var,iVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&local_78,&local_7d);
    choc::text::addDoubleQuotes(&local_48,&local_68);
  }
  local_8d = !local_8d;
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  (*this->_vptr_ValuePrinter[0x13])(this,local_28._0_8_,local_28._8_8_);
  std::__cxx11::string::~string((string *)&local_48);
  if (local_8d) {
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_7d);
  }
  return;
}

Assistant:

void ValuePrinter::printStringLiteral (StringDictionary::Handle h)
{
    print (dictionary != nullptr ? choc::text::addDoubleQuotes (std::string (dictionary->getStringForHandle (h)))
                                 : std::to_string (h.handle));
}